

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O1

void __thiscall
sc_core::sc_signal<bool,_(sc_core::sc_writer_policy)0>::update
          (sc_signal<bool,_(sc_core::sc_writer_policy)0> *this)

{
  int *piVar1;
  sc_process_b *this_00;
  
  if ((this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).
      super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>.super_sc_writer_policy_check_write.
      m_delta_only == true) {
    this_00 = (this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).
              super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>.
              super_sc_writer_policy_check_write.m_writer_p.m_target_p;
    (this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).
    super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>.super_sc_writer_policy_check_write.
    m_writer_p.m_target_p = (sc_process_b *)0x0;
    if (this_00 != (sc_process_b *)0x0) {
      piVar1 = &this_00->m_references_n;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        sc_process_b::delete_process(this_00);
      }
    }
  }
  if ((this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).m_new_val ==
      (this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).m_cur_val) {
    return;
  }
  do_update(this);
  return;
}

Assistant:

void
sc_signal<bool,POL>::update()
{
    policy_type::update();
    if( !( base_type::m_new_val == base_type::m_cur_val ) ) {
        do_update();
    }
}